

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O2

void __thiscall
ExtraData::parseVT_ERROR
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int from,int to)

{
  longlong errorType;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_28,val);
  errorType = Utils::vectEightBytesToUnsignedInt
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_28,from);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_28);
  ExtraDataUtils::parseError(errorType);
  return;
}

Assistant:

void ExtraData::parseVT_ERROR(std::vector<unsigned int> val, int from, int to) {
    long long int errorVal = Utils::vectEightBytesToUnsignedInt(val, from);
    ExtraDataUtils::parseError(errorVal );
}